

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_index_t itree_find(itree_t *t,cell_index_t *end,cell_index_t start,cell_id_t id)

{
  cell_id_t cVar1;
  cell_t *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  pcVar2 = t->cell;
  uVar4 = (ulong)start;
  if (pcVar2[uVar4].id == 0xffffffff) {
    uVar5 = start;
    start = 0xffffffff;
  }
  else {
    uVar5 = 0xffffffff;
    if (start != 0xffffffff) {
      cVar1 = pcVar2[uVar4].id;
      while (uVar3 = start, start = uVar3, cVar1 != id) {
        start = pcVar2[uVar4].sib;
        uVar4 = (ulong)start;
        uVar5 = uVar3;
        if (uVar4 == 0xffffffff) break;
        cVar1 = pcVar2[uVar4].id;
      }
    }
  }
  *end = uVar5;
  return start;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}